

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void CreateDefaultClassConstructor
               (ExpressionContext *ctx,SynBase *source,ExprClassDefinition *classDefinition)

{
  uint uniqueId;
  TypeClass *classType_00;
  ScopeData *pSVar1;
  Allocator *allocator;
  TypeBase *pTVar2;
  IntrusiveList<ExprVariableDefinition> arguments_00;
  IntrusiveList<ExprBase> expressions_00;
  IntrusiveList<MatchData> generics;
  bool bVar3;
  bool bVar4;
  TypeArray *pTVar5;
  SynIdentifier *pSVar6;
  FunctionData *pFVar7;
  TypeFunction *pTVar8;
  TypeRef *contextType;
  SynBase *pSVar9;
  ExprReturn *this;
  ExprBase *pEVar10;
  ExprBase *closures;
  ExprFunctionDefinition *this_00;
  char *pcVar11;
  ArrayView<ArgumentData> arguments_01;
  InplaceStr IVar12;
  IntrusiveList<ExprVariableDefinition> local_730;
  ExprVariableDefinition *local_720;
  ExprVariableDefinition *contextVariableDefinition;
  VariableData *contextVariable;
  IntrusiveList<ExprBase> expressions;
  ExprVariableDefinition *contextArgumentDefinition;
  IntrusiveList<MatchData> local_6e0;
  undefined1 local_6d0 [12];
  FunctionData *local_6c0;
  FunctionData *function;
  char *pcStack_6b0;
  SynIdentifier *local_698;
  SynIdentifier *functionNameIdentifier;
  SmallArray<ArgumentData,_32U> arguments;
  FunctionData *pFStack_68;
  InplaceStr functionName;
  bool addedParentScope;
  TypeArray *arrType;
  TypeBase *base;
  MemberHandle *el;
  bool customConstructor;
  TypeClass *classType;
  ExprClassDefinition *classDefinition_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  classType_00 = classDefinition->classType;
  bVar4 = false;
  if ((classType_00->extendable & 1U) == 0) {
    for (base = (TypeBase *)(classType_00->super_TypeStruct).members.head; base != (TypeBase *)0x0;
        base = (TypeBase *)(base->name).end) {
      arrType = *(TypeArray **)(*(long *)&base->typeID + 0x20);
      while (pTVar5 = getType<TypeArray>(&arrType->super_TypeBase), pTVar5 != (TypeArray *)0x0) {
        arrType = (TypeArray *)pTVar5->subType;
      }
      if ((base->name).begin != (char *)0x0) {
        bVar4 = true;
        break;
      }
      bVar3 = HasDefaultConstructor(ctx,source,&arrType->super_TypeBase);
      if (bVar3) {
        bVar4 = true;
        break;
      }
    }
  }
  else {
    bVar4 = true;
  }
  if (bVar4) {
    bVar4 = RestoreParentTypeScope(ctx,source,(TypeBase *)classType_00);
    pSVar1 = ctx->scope;
    join_0x00000010_0x00000000_ = GetTypeDefaultConstructorName(ctx,classType_00);
    IVar12 = GetFunctionNameInScope
                       (ctx,pSVar1,(TypeBase *)classType_00,join_0x00000010_0x00000000_,false,false)
    ;
    SmallArray<ArgumentData,_32U>::SmallArray
              ((SmallArray<ArgumentData,_32U> *)&functionNameIdentifier,ctx->allocator);
    pSVar6 = ExpressionContext::get<SynIdentifier>(ctx);
    pFStack_68 = (FunctionData *)IVar12.begin;
    functionName.begin = IVar12.end;
    function = pFStack_68;
    pcStack_6b0 = functionName.begin;
    SynIdentifier::SynIdentifier(pSVar6,IVar12);
    local_698 = pSVar6;
    pFVar7 = ExpressionContext::get<FunctionData>(ctx);
    allocator = ctx->allocator;
    pSVar1 = ctx->scope;
    pTVar2 = ctx->typeVoid;
    ArrayView<ArgumentData>::ArrayView<32u>
              ((ArrayView<ArgumentData> *)local_6d0,
               (SmallArray<ArgumentData,_32U> *)&functionNameIdentifier);
    arguments_01._12_4_ = 0;
    arguments_01.data = (ArgumentData *)local_6d0._0_8_;
    arguments_01.count = local_6d0._8_4_;
    pTVar8 = ExpressionContext::GetFunctionType(ctx,source,pTVar2,arguments_01);
    contextType = ExpressionContext::GetReferenceType(ctx,(TypeBase *)classType_00);
    pSVar6 = local_698;
    IntrusiveList<MatchData>::IntrusiveList(&local_6e0);
    uniqueId = ctx->uniqueFunctionId;
    ctx->uniqueFunctionId = uniqueId + 1;
    pcVar11 = (char *)0x0;
    generics.tail = local_6e0.tail;
    generics.head = local_6e0.head;
    FunctionData::FunctionData
              (pFVar7,allocator,source,pSVar1,false,false,false,pTVar8,&contextType->super_TypeBase,
               pSVar6,generics,uniqueId);
    IVar12.end = pcVar11;
    IVar12.begin = (pFVar7->name->name).end;
    local_6c0 = pFVar7;
    anon_unknown.dwarf_6f1cc::CheckFunctionConflict
              ((anon_unknown_dwarf_6f1cc *)ctx,(ExpressionContext *)source,
               (SynBase *)(pFVar7->name->name).begin,IVar12);
    ExpressionContext::AddFunction(ctx,local_6c0);
    ExpressionContext::PushScope(ctx,local_6c0);
    local_6c0->functionScope = ctx->scope;
    pSVar9 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
    expressions.tail = &CreateFunctionContextArgument(ctx,pSVar9,local_6c0)->super_ExprBase;
    local_6c0->argumentsSize = local_6c0->functionScope->dataSize;
    IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&contextVariable);
    CreateDefaultConstructorCode
              (ctx,source,classType_00,(IntrusiveList<ExprBase> *)&contextVariable);
    this = ExpressionContext::get<ExprReturn>(ctx);
    pTVar2 = ctx->typeVoid;
    pEVar10 = &ExpressionContext::get<ExprVoid>(ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar10,source,ctx->typeVoid);
    pSVar9 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
    closures = CreateFunctionUpvalueClose(ctx,pSVar9,local_6c0,ctx->scope);
    ExprReturn::ExprReturn(this,source,pTVar2,pEVar10,(ExprBase *)0x0,closures);
    IntrusiveList<ExprBase>::push_back
              ((IntrusiveList<ExprBase> *)&contextVariable,&this->super_ExprBase);
    ClosePendingUpvalues(ctx,local_6c0);
    ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
    if (bVar4) {
      ExpressionContext::PopScope(ctx,SCOPE_TYPE);
    }
    contextVariableDefinition =
         (ExprVariableDefinition *)
         CreateFunctionContextVariable(ctx,source,local_6c0,(FunctionData *)0x0);
    local_720 = CreateFunctionContextVariableDefinition
                          (ctx,source,local_6c0,(FunctionData *)0x0,
                           (VariableData *)contextVariableDefinition);
    this_00 = ExpressionContext::get<ExprFunctionDefinition>(ctx);
    pFVar7 = local_6c0;
    pEVar10 = expressions.tail;
    pTVar8 = local_6c0->type;
    IntrusiveList<ExprVariableDefinition>::IntrusiveList(&local_730);
    arguments_00.tail = local_730.tail;
    arguments_00.head = local_730.head;
    expressions_00.tail = expressions.head;
    expressions_00.head = (ExprBase *)contextVariable;
    ExprFunctionDefinition::ExprFunctionDefinition
              (this_00,source,&pTVar8->super_TypeBase,pFVar7,(ExprVariableDefinition *)pEVar10,
               arguments_00,(ExprBase *)0x0,expressions_00,local_720,
               (VariableData *)contextVariableDefinition);
    local_6c0->declaration = &this_00->super_ExprBase;
    SmallArray<ExprBase_*,_128U>::push_back(&ctx->definitions,&local_6c0->declaration);
    IntrusiveList<ExprBase>::push_back(&classDefinition->functions,local_6c0->declaration);
    SmallArray<FunctionData_*,_4U>::push_back(&classType_00->methods,&local_6c0);
    SmallArray<ArgumentData,_32U>::~SmallArray
              ((SmallArray<ArgumentData,_32U> *)&functionNameIdentifier);
  }
  return;
}

Assistant:

void CreateDefaultClassConstructor(ExpressionContext &ctx, SynBase *source, ExprClassDefinition *classDefinition)
{
	TypeClass *classType = classDefinition->classType;

	// Check if custom default assignment operator is required
	bool customConstructor = false;

	if(classType->extendable)
	{
		customConstructor = true;
	}
	else
	{
		for(MemberHandle *el = classType->members.head; el; el = el->next)
		{
			TypeBase *base = el->variable->type;

			// Find array element type
			while(TypeArray *arrType = getType<TypeArray>(base))
				base = arrType->subType;

			if(el->initializer)
			{
				customConstructor = true;
				break;
			}

			if(HasDefaultConstructor(ctx, source, base))
			{
				customConstructor = true;
				break;
			}
		}
	}

	if(customConstructor)
	{
		bool addedParentScope = RestoreParentTypeScope(ctx, source, classType);

		InplaceStr functionName = GetFunctionNameInScope(ctx, ctx.scope, classType, GetTypeDefaultConstructorName(ctx, classType), false, false);

		SmallArray<ArgumentData, 32> arguments(ctx.allocator);

		SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

		FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, false, false, false, ctx.GetFunctionType(source, ctx.typeVoid, arguments), ctx.GetReferenceType(classType), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

		CheckFunctionConflict(ctx, source, function->name->name);

		ctx.AddFunction(function);

		ctx.PushScope(function);

		function->functionScope = ctx.scope;

		ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

		function->argumentsSize = function->functionScope->dataSize;

		IntrusiveList<ExprBase> expressions;

		CreateDefaultConstructorCode(ctx, source, classType, expressions);

		expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprVoid>()) ExprVoid(source, ctx.typeVoid), NULL, CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(source), function, ctx.scope)));

		ClosePendingUpvalues(ctx, function);

		ctx.PopScope(SCOPE_FUNCTION);

		if(addedParentScope)
			ctx.PopScope(SCOPE_TYPE);

		VariableData *contextVariable = CreateFunctionContextVariable(ctx, source, function, NULL);
		ExprVariableDefinition *contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, source, function, NULL, contextVariable);

		function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, IntrusiveList<ExprVariableDefinition>(), NULL, expressions, contextVariableDefinition, contextVariable);

		ctx.definitions.push_back(function->declaration);

		classDefinition->functions.push_back(function->declaration);

		classType->methods.push_back(function);
	}
}